

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

int exr_set_display_window(exr_context_t ctxt,int part_index,exr_attr_box2i_t *dw)

{
  long lVar1;
  exr_attr_box2i_t *peVar2;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 aVar3;
  int iVar4;
  exr_result_t eVar5;
  code *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *peVar6;
  undefined8 uStackY_30;
  
  if (dw == (exr_attr_box2i_t *)0x0) {
    iVar4 = (**(code **)(ctxt + 0x40))(ctxt,3,"Missing value for data window assignment");
    return iVar4;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (*ctxt == (_priv_exr_context_t)0x3) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uStackY_30 = 0x15;
    }
    else {
      if (*ctxt != (_priv_exr_context_t)0x0) {
        lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
        peVar6 = *(exr_attribute_t **)(lVar1 + 0x38);
        if (peVar6 == (exr_attribute_t *)0x0) {
          eVar5 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"displayWindow",
                                    EXR_ATTR_BOX2I,0,(uint8_t **)0x0,
                                    (exr_attribute_t **)(lVar1 + 0x38));
          if (eVar5 != 0) {
            return eVar5;
          }
          peVar6 = *(exr_attribute_t **)(lVar1 + 0x38);
        }
        else if (peVar6->type != EXR_ATTR_BOX2I) {
          iVar4 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             peVar6->type_name,"displayWindow",*(code **)(ctxt + 0x48));
          return iVar4;
        }
        peVar2 = (peVar6->field_6).box2i;
        aVar3 = (dw->max).field_0;
        (peVar2->min).field_0 = (dw->min).field_0;
        (peVar2->max).field_0 = aVar3;
        aVar3 = (dw->max).field_0;
        *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)(lVar1 + 0xa0) = (dw->min).field_0;
        *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)(lVar1 + 0xa8) = aVar3;
        return 0;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uStackY_30 = 8;
    }
    iVar4 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_30);
    return iVar4;
  }
  iVar4 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return iVar4;
}

Assistant:

exr_result_t
exr_set_display_window (
    exr_context_t ctxt, int part_index, const exr_attr_box2i_t* dw)
{
    if (!dw)
        return EXR_CTXT (ctxt)->report_error (
            EXR_CTXT (ctxt),
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment");

    REQ_ATTR_FIND_CREATE (displayWindow, EXR_ATTR_BOX2I);
    if (rv == EXR_ERR_SUCCESS)
    {
        *(attr->box2i)       = *dw;
        part->display_window = *dw;
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}